

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O2

DdNode * cuddBddExistAbstractRecur(DdManager *manager,DdNode *f,DdNode *cube)

{
  int *piVar1;
  DdNode *f_00;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  uint uVar6;
  DdNode *f_01;
  DdNode *pDVar7;
  
  pDVar4 = manager->one;
  pDVar7 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  if (pDVar4 == pDVar7 || pDVar4 == cube) {
    return f;
  }
  uVar2 = pDVar7->index;
  while (uVar6 = cube->index, manager->perm[uVar6] < manager->perm[uVar2]) {
    cube = (cube->type).kids.T;
    if (cube == pDVar4) {
      return f;
    }
  }
  if (pDVar7->ref != 1) {
    pDVar3 = cuddCacheLookup2(manager,Cudd_bddExistAbstract,f,cube);
    if (pDVar3 != (DdNode *)0x0) {
      return pDVar3;
    }
    uVar2 = pDVar7->index;
    uVar6 = cube->index;
  }
  pDVar3 = (pDVar7->type).kids.T;
  pDVar5 = (pDVar7->type).kids.E;
  f_01 = (DdNode *)((ulong)pDVar5 ^ 1);
  f_00 = (DdNode *)((ulong)pDVar3 ^ 1);
  if (pDVar7 == f) {
    f_01 = pDVar5;
    f_00 = pDVar3;
  }
  if (uVar2 == uVar6) {
    if (f_00 == pDVar4) {
      return pDVar4;
    }
    if (f_01 == pDVar4) {
      return pDVar4;
    }
    if (f_00 == (DdNode *)((ulong)f_01 ^ 1)) {
      return pDVar4;
    }
    pDVar3 = cuddBddExistAbstractRecur(manager,f_00,(cube->type).kids.T);
    if (pDVar3 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    if (pDVar3 == pDVar4) {
      if (pDVar7->ref != 1) {
        cuddCacheInsert2(manager,Cudd_bddExistAbstract,f,cube,pDVar4);
        return pDVar4;
      }
      return pDVar4;
    }
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = cuddBddExistAbstractRecur(manager,f_01,(cube->type).kids.T);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar3 ^ 1),(DdNode *)((ulong)pDVar4 ^ 1));
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_IterDerefBdd(manager,pDVar3);
        Cudd_IterDerefBdd(manager,pDVar4);
        if (pDVar7->ref != 1) {
          cuddCacheInsert2(manager,Cudd_bddExistAbstract,f,cube,(DdNode *)((ulong)pDVar5 ^ 1));
        }
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return (DdNode *)((ulong)pDVar5 ^ 1);
      }
      Cudd_IterDerefBdd(manager,pDVar3);
      pDVar3 = pDVar4;
    }
  }
  else {
    pDVar3 = cuddBddExistAbstractRecur(manager,f_00,cube);
    if (pDVar3 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = cuddBddExistAbstractRecur(manager,f_01,cube);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddBddIteRecur(manager,manager->vars[pDVar7->index],pDVar3,pDVar4);
      if (pDVar5 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_IterDerefBdd(manager,pDVar3);
        Cudd_IterDerefBdd(manager,pDVar4);
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        if (pDVar7->ref != 1) {
          cuddCacheInsert2(manager,Cudd_bddExistAbstract,f,cube,pDVar5);
          return pDVar5;
        }
        return pDVar5;
      }
      Cudd_IterDerefBdd(manager,pDVar3);
      pDVar3 = pDVar4;
    }
  }
  Cudd_IterDerefBdd(manager,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddExistAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * cube)
{
    DdNode      *F, *T, *E, *res, *res1, *res2, *one;

    statLine(manager);
    one = DD_ONE(manager);
    F = Cudd_Regular(f);

    /* Cube is guaranteed to be a cube at this point. */        
    if (cube == one || F == one) {  
        return(f);
    }
    /* From now on, f and cube are non-constant. */

    /* Abstract a variable that does not appear in f. */
    while (manager->perm[F->index] > manager->perm[cube->index]) {
        cube = cuddT(cube);
        if (cube == one) return(f);
    }

    /* Check the cache. */
    if (F->ref != 1 && (res = cuddCacheLookup2(manager, Cudd_bddExistAbstract, f, cube)) != NULL) {
        return(res);
    }

    /* Compute the cofactors of f. */
    T = cuddT(F); E = cuddE(F);
    if (f != F) {
        T = Cudd_Not(T); E = Cudd_Not(E);
    }

    /* If the two indices are the same, so are their levels. */
    if (F->index == cube->index) {
        if (T == one || E == one || T == Cudd_Not(E)) {
            return(one);
        }
        res1 = cuddBddExistAbstractRecur(manager, T, cuddT(cube));
        if (res1 == NULL) return(NULL);
        if (res1 == one) {
            if (F->ref != 1)
                cuddCacheInsert2(manager, Cudd_bddExistAbstract, f, cube, one);
            return(one);
        }
        cuddRef(res1);
        res2 = cuddBddExistAbstractRecur(manager, E, cuddT(cube));
        if (res2 == NULL) {
            Cudd_IterDerefBdd(manager,res1);
            return(NULL);
        }
        cuddRef(res2);
        res = cuddBddAndRecur(manager, Cudd_Not(res1), Cudd_Not(res2));
        if (res == NULL) {
            Cudd_IterDerefBdd(manager, res1);
            Cudd_IterDerefBdd(manager, res2);
            return(NULL);
        }
        res = Cudd_Not(res);
        cuddRef(res);
        Cudd_IterDerefBdd(manager, res1);
        Cudd_IterDerefBdd(manager, res2);
        if (F->ref != 1)
            cuddCacheInsert2(manager, Cudd_bddExistAbstract, f, cube, res);
        cuddDeref(res);
        return(res);
    } else { /* if (cuddI(manager,F->index) < cuddI(manager,cube->index)) */
        res1 = cuddBddExistAbstractRecur(manager, T, cube);
        if (res1 == NULL) return(NULL);
        cuddRef(res1);
        res2 = cuddBddExistAbstractRecur(manager, E, cube);
        if (res2 == NULL) {
            Cudd_IterDerefBdd(manager, res1);
            return(NULL);
        }
        cuddRef(res2);
        /* ITE takes care of possible complementation of res1 and of the
        ** case in which res1 == res2. */
        res = cuddBddIteRecur(manager, manager->vars[F->index], res1, res2);
        if (res == NULL) {
            Cudd_IterDerefBdd(manager, res1);
            Cudd_IterDerefBdd(manager, res2);
            return(NULL);
        }
        cuddRef(res); //Added
        Cudd_IterDerefBdd(manager, res1); //cuddDeref(res1);
        Cudd_IterDerefBdd(manager, res2); //cuddDeref(res2);
        cuddDeref(res); //Added
        if (F->ref != 1)
            cuddCacheInsert2(manager, Cudd_bddExistAbstract, f, cube, res);
        return(res);
    }       

}